

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowLevelIoExamples.cpp
# Opt level: O0

void lowLevelIoExamples(void)

{
  ostream *poVar1;
  FILE *__stream;
  stringstream _iex_throw_errno_s_1;
  FILE *file_1;
  stringstream _iex_throw_errno_s;
  FILE *file;
  Array2D<Imf_3_2::Rgba> p;
  char *fileName;
  int h;
  int w;
  Array2D<Imf_3_2::Rgba> *in_stack_fffffffffffffc00;
  long in_stack_fffffffffffffc40;
  long in_stack_fffffffffffffc48;
  Array2D<Imf_3_2::Rgba> *this;
  string local_398 [32];
  int in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  Array2D<Imf_3_2::Rgba> *in_stack_fffffffffffffc90;
  int *in_stack_fffffffffffffc98;
  Array2D<Imf_3_2::Rgba> *in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcac;
  Rgba *in_stack_fffffffffffffcb0;
  char *in_stack_fffffffffffffcb8;
  FILE *in_stack_fffffffffffffcc0;
  string local_1e8 [32];
  stringstream local_1c8 [16];
  ostream local_1b8 [376];
  FILE *local_40;
  Array2D<Imf_3_2::Rgba> local_28;
  char *local_10;
  undefined4 local_8;
  undefined4 local_4;
  
  this = (Array2D<Imf_3_2::Rgba> *)&std::cout;
  poVar1 = std::operator<<((ostream *)&std::cout,"\nCustom low-level file I/O\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)this,"drawing image");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_4 = 800;
  local_8 = 600;
  local_10 = "rgba4.exr";
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D(this,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40)
  ;
  drawImage1(in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88);
  poVar1 = std::operator<<((ostream *)&std::cout,"writing image");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_40 = fopen(local_10,"wb");
  if (local_40 == (FILE *)0x0) {
    std::__cxx11::stringstream::stringstream(local_1c8);
    poVar1 = std::operator<<(local_1b8,"Cannot open file ");
    poVar1 = std::operator<<(poVar1,local_10);
    std::operator<<(poVar1," (%T).");
    std::__cxx11::stringstream::str();
    Iex_3_2::throwErrnoExc(local_1e8);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::stringstream::~stringstream(local_1c8);
  }
  else {
    Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_28,0);
    writeRgbaFILE(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                  in_stack_fffffffffffffcac,in_stack_fffffffffffffca8);
    fclose(local_40);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"reading image");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  __stream = fopen(local_10,"rb");
  if (__stream == (FILE *)0x0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffc88);
    in_stack_fffffffffffffc00 =
         (Array2D<Imf_3_2::Rgba> *)
         std::operator<<((ostream *)&stack0xfffffffffffffc98,"Cannot open file ");
    poVar1 = std::operator<<((ostream *)in_stack_fffffffffffffc00,local_10);
    std::operator<<(poVar1," (%T).");
    std::__cxx11::stringstream::str();
    Iex_3_2::throwErrnoExc(local_398);
    std::__cxx11::string::~string(local_398);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffc88);
  }
  else {
    readRgbaFILE((FILE *)in_stack_fffffffffffffcb0,
                 (char *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                 in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                 (int *)in_stack_fffffffffffffc90);
    fclose(__stream);
  }
  Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(in_stack_fffffffffffffc00);
  return;
}

Assistant:

void
lowLevelIoExamples ()
{
    cout << "\nCustom low-level file I/O\n" << endl;
    cout << "drawing image" << endl;

    int         w        = 800;
    int         h        = 600;
    const char* fileName = "rgba4.exr";

    Array2D<Rgba> p (h, w);
    drawImage1 (p, w, h);

    //
    // The following code is somewhat complicated because
    // fopen() returns 0 on error, but writeRgbaFILE() and
    // readRgbaFILE() throw exceptions.  Also, if a FILE *
    // goes out of scope, the corresponding file is not
    // automatically closed.  In order to avoid leaking
    // file descriptors, we have to make sure fclose() is
    // called in all cases.
    //

    cout << "writing image" << endl;

    {
        FILE* file = fopen (fileName, "wb");

        if (file == 0)
        {
            THROW_ERRNO ("Cannot open file " << fileName << " (%T).");
        }
        else
        {
            try
            {
                writeRgbaFILE (file, fileName, &p[0][0], w, h);
            }
            catch (...)
            {
                fclose (file);
                throw;
            }

            fclose (file);
        }
    }

    cout << "reading image" << endl;

    {
        FILE* file = fopen (fileName, "rb");

        if (file == 0)
        {
            THROW_ERRNO ("Cannot open file " << fileName << " (%T).");
        }
        else
        {
            try
            {
                readRgbaFILE (file, fileName, p, w, h);
            }
            catch (...)
            {
                fclose (file);
                throw;
            }

            fclose (file);
        }
    }
}